

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O2

Fl_Menu_Item * next_visible_or_not(Fl_Menu_Item *m)

{
  int iVar1;
  
  iVar1 = 0;
  do {
    if (m->text == (char *)0x0) {
      if (iVar1 == 0) {
        return m;
      }
      iVar1 = iVar1 + -1;
    }
    else {
      iVar1 = iVar1 + (uint)(((uint)m->flags >> 6 & 1) != 0);
    }
    m = m + 1;
  } while (iVar1 != 0);
  return m;
}

Assistant:

static const Fl_Menu_Item* next_visible_or_not(const Fl_Menu_Item* m) {
  int nest = 0;
  do {
    if (!m->text) {
      if (!nest) return m;
      nest--;
    } else if (m->flags&FL_SUBMENU) {
      nest++;
    }
    m++;
  }
  while (nest);
  return m;
}